

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool check_for_unreserved_blocks(wchar_t by1,wchar_t bx1,wchar_t by2,wchar_t bx2)

{
  _Bool _Var1;
  wchar_t wVar2;
  ulong uVar3;
  _Bool *p_Var4;
  
  _Var1 = false;
  if (((L'\xffffffff' < by1) && (L'\xffffffff' < bx1)) && (_Var1 = false, by2 < dun->row_blocks)) {
    if (bx2 < dun->col_blocks) {
      _Var1 = true;
      if (by1 <= by2) {
        uVar3 = (ulong)(uint)by1;
        do {
          if (bx1 <= bx2) {
            p_Var4 = dun->room_map[uVar3] + (uint)bx1;
            wVar2 = bx1 + L'\xffffffff';
            do {
              if (*p_Var4 != false) goto LAB_001540cb;
              wVar2 = wVar2 + L'\x01';
              p_Var4 = p_Var4 + 1;
            } while (wVar2 < bx2);
          }
          wVar2 = (wchar_t)uVar3;
          uVar3 = uVar3 + 1;
        } while (wVar2 < by2);
      }
    }
    else {
LAB_001540cb:
      _Var1 = false;
    }
  }
  return _Var1;
}

Assistant:

static bool check_for_unreserved_blocks(int by1, int bx1, int by2, int bx2)
{
	int by, bx;

	/* Never run off the screen */
	if (by1 < 0 || by2 >= dun->row_blocks) return false;
	if (bx1 < 0 || bx2 >= dun->col_blocks) return false;

	/* Verify open space */
	for (by = by1; by <= by2; by++) {
		for (bx = bx1; bx <= bx2; bx++) {
			if (dun->room_map[by][bx]) return false;
		}
	}
	return true;
}